

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall arealights::Application::onRender(Application *this)

{
  anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2_0 aVar1
  ;
  undefined1 uVar2;
  EArealightMethod EVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  DeferredRenderingPipeline *pDVar7;
  ivec2 iVar8;
  element_type *peVar9;
  PointLightCluster *this_00;
  LinearlyTransformedCosines *pLVar10;
  GroundTruth *pGVar11;
  ShaderProgram *this_01;
  anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2_0 aVar12;
  mat4 modelMatrix;
  mat4 viewMatrix_00;
  mat4 projectionMatrix;
  mat4 modelMatrix_00;
  mat4 viewMatrix_01;
  mat4 projectionMatrix_00;
  undefined4 x_00;
  undefined4 y;
  undefined8 uVar13;
  anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2 *paVar14;
  long lVar15;
  Writer *pWVar16;
  long lVar17;
  ostream *poVar18;
  tm *ptVar19;
  int iVar20;
  pointer v;
  sockaddr *__addr;
  GLbitfield GVar21;
  long lVar22;
  int iVar23;
  FreeCamera *this_02;
  int iVar24;
  int x;
  int iVar25;
  int iVar26;
  int iVar27;
  GLsizei GVar28;
  int i;
  GLsizei GVar29;
  float fVar30;
  initializer_list<arealights::PolygonalLight> __l;
  initializer_list<arealights::PolygonalLight> __l_00;
  initializer_list<arealights::PolygonalLight> __l_01;
  _Put_time<char> __f;
  ivec2 framebufferSize;
  tmat4x4<float,_(glm::precision)0> lightWorldMatrix;
  undefined1 local_5b0 [16];
  char *local_5a0;
  undefined8 local_598;
  char *local_590;
  undefined2 local_588;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_580;
  Logger *local_570;
  char *local_568;
  DispatchAction local_560;
  pointer local_558;
  pointer pbStack_550;
  pointer local_548;
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined4 local_518;
  undefined4 local_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 local_504;
  vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_> local_500;
  vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_> local_4e8;
  vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_> local_4d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  mat4 viewMatrix;
  string methodName;
  tmat4x4<float,_(glm::precision)0> projMatrix;
  stringstream ss;
  undefined1 auStack_3a8 [20];
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 aStack_394;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 aStack_384;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 aStack_374;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 aStack_364;
  undefined4 uStack_354;
  pointer local_350;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_230;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_220;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_210;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_200;
  tmat4x4<float,_(glm::precision)0> local_1f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> orig;
  time_t in_time_t;
  undefined4 uStack_168;
  undefined8 uStack_164;
  undefined4 local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_148;
  undefined8 local_144;
  undefined8 uStack_13c;
  undefined4 local_134;
  tmat4x4<float,_(glm::precision)0> planeUpMatrix;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_f0 [2];
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0;
  undefined8 local_ac;
  undefined8 uStack_a4;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  undefined8 local_84;
  undefined8 uStack_7c;
  undefined4 local_74;
  tmat4x4<float,_(glm::precision)0> local_70;
  
  paVar14 = &fw::OpenGLApplication::getFramebufferSize((OpenGLApplication *)this)->field_0;
  framebufferSize.field_0 =
       (anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2)
       *(anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2 *)&paVar14->field_0;
  iVar20 = framebufferSize.field_0._0_4_;
  iVar23 = framebufferSize.field_0._4_4_;
  lVar15 = std::chrono::_V2::system_clock::now();
  this_02 = (this->_camera).super___shared_ptr<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  fw::FreeCamera::getViewMatrix(&viewMatrix,this_02);
  iVar24 = (int)this_02;
  glm::perspectiveRH<float>(&projMatrix,0.7853982,(float)iVar20 / (float)iVar23,0.1,100.0);
  DeferredRenderingPipeline::startGeometryPass
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl);
  (*glad_glEnable)(0xb71);
  local_540 = 0x3f800000;
  uStack_53c = 0;
  uStack_538 = 0;
  uStack_534 = 0;
  uStack_530 = 0;
  uStack_52c = 0x3f800000;
  uStack_528 = 0;
  uStack_520 = 0;
  local_518 = 0x3f800000;
  local_514 = 0;
  uStack_510 = 0;
  uStack_50c = 0;
  uStack_508 = 0;
  local_504 = 0x3f800000;
  modelMatrix.value[2].field_0._8_8_ = 0x3f800000;
  modelMatrix.value._0_40_ = ZEXT2440(CONCAT420(0x3f800000,ZEXT820(0x3f800000)));
  modelMatrix.value[3].field_0._0_8_ = 0;
  modelMatrix.value[3].field_0._8_8_ = 0x3f80000000000000;
  DeferredRenderingPipeline::setModelMatrix
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,
             modelMatrix);
  viewMatrix_00.value[0].field_0.field_0.z = (float)(int)viewMatrix.value[0].field_0._8_8_;
  viewMatrix_00.value[0].field_0._0_8_ = viewMatrix.value[0].field_0._0_8_;
  viewMatrix_00.value[0].field_0.field_0.w =
       (float)(int)((ulong)viewMatrix.value[0].field_0._8_8_ >> 0x20);
  viewMatrix_00.value[1].field_0.field_0.x = (float)(int)viewMatrix.value[1].field_0._0_8_;
  viewMatrix_00.value[1].field_0.field_0.y =
       (float)(int)((ulong)viewMatrix.value[1].field_0._0_8_ >> 0x20);
  viewMatrix_00.value[1].field_0.field_0.z = (float)(int)viewMatrix.value[1].field_0._8_8_;
  viewMatrix_00.value[1].field_0.field_0.w =
       (float)(int)((ulong)viewMatrix.value[1].field_0._8_8_ >> 0x20);
  viewMatrix_00.value[2].field_0._0_8_ = viewMatrix.value[2].field_0._0_8_;
  viewMatrix_00.value[2].field_0._8_8_ = viewMatrix.value[2].field_0._8_8_;
  viewMatrix_00.value[3].field_0._0_8_ = viewMatrix.value[3].field_0._0_8_;
  viewMatrix_00.value[3].field_0._8_8_ = viewMatrix.value[3].field_0._8_8_;
  DeferredRenderingPipeline::setViewMatrix
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,
             viewMatrix_00);
  projectionMatrix.value[0].field_0.field_0.z = (float)(int)projMatrix.value[0].field_0._8_8_;
  projectionMatrix.value[0].field_0._0_8_ = projMatrix.value[0].field_0._0_8_;
  projectionMatrix.value[0].field_0.field_0.w =
       (float)(int)((ulong)projMatrix.value[0].field_0._8_8_ >> 0x20);
  projectionMatrix.value[1].field_0.field_0.x = (float)(int)projMatrix.value[1].field_0._0_8_;
  projectionMatrix.value[1].field_0.field_0.y =
       (float)(int)((ulong)projMatrix.value[1].field_0._0_8_ >> 0x20);
  projectionMatrix.value[1].field_0.field_0.z = (float)(int)projMatrix.value[1].field_0._8_8_;
  projectionMatrix.value[1].field_0.field_0.w =
       (float)(int)((ulong)projMatrix.value[1].field_0._8_8_ >> 0x20);
  projectionMatrix.value[2].field_0._0_8_ = projMatrix.value[2].field_0._0_8_;
  projectionMatrix.value[2].field_0._8_8_ = projMatrix.value[2].field_0._8_8_;
  projectionMatrix.value[3].field_0._0_8_ = projMatrix.value[3].field_0._0_8_;
  projectionMatrix.value[3].field_0._8_8_ = projMatrix.value[3].field_0._8_8_;
  DeferredRenderingPipeline::setProjectionMatrix
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,
             projectionMatrix);
  DeferredRenderingPipeline::setMaterialID
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,0.1
            );
  v = (this->_materialMap).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  Material::bind(v[(this->_interface)._activeMaterial].second.
                 super___shared_ptr<Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr,iVar24,__addr,
                 (socklen_t)v);
  std::__shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)local_5b0,
             &(((this->_deferredPipeline)._M_t.
                super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
                ._M_t.
                super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
                .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl)
              ->_geometryPassShader).
              super___shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>);
  uVar13 = local_5b0._0_8_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"SolidMode",(allocator<char> *)&lightWorldMatrix);
  fw::ShaderProgram::setUniform
            ((ShaderProgram *)uVar13,(string *)&ss,(this->_interface)._sceneRadio);
  std::__cxx11::string::~string((string *)&ss);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5b0 + 8));
  std::__shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)local_5b0,
             &(((this->_deferredPipeline)._M_t.
                super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
                ._M_t.
                super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
                .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl)
              ->_geometryPassShader).
              super___shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>);
  uVar13 = local_5b0._0_8_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"MetalnessConst",(allocator<char> *)&lightWorldMatrix);
  fw::ShaderProgram::setUniform((ShaderProgram *)uVar13,(string *)&ss,(this->_interface)._metalness)
  ;
  std::__cxx11::string::~string((string *)&ss);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5b0 + 8));
  std::__shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)local_5b0,
             &(((this->_deferredPipeline)._M_t.
                super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
                ._M_t.
                super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
                .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl)
              ->_geometryPassShader).
              super___shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"RoughnessConst",(allocator<char> *)&lightWorldMatrix);
  fw::ShaderProgram::setUniform
            ((ShaderProgram *)local_5b0._0_8_,(string *)&ss,(this->_interface)._roughness);
  std::__cxx11::string::~string((string *)&ss);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5b0 + 8));
  (*(((this->_planeMesh)._M_t.
      super___uniq_ptr_impl<fw::Mesh<fw::StandardVertex3D>,_std::default_delete<fw::Mesh<fw::StandardVertex3D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_fw::Mesh<fw::StandardVertex3D>_*,_std::default_delete<fw::Mesh<fw::StandardVertex3D>_>_>
      .super__Head_base<0UL,_fw::Mesh<fw::StandardVertex3D>_*,_false>._M_head_impl)->super_IMesh).
    _vptr_IMesh[3])();
  methodName._M_dataplus._M_p._0_4_ = 0x3f800000;
  methodName._4_8_ = 0;
  methodName._12_8_ = 0;
  methodName.field_2._M_allocated_capacity._4_4_ = 0x3f800000;
  methodName.field_2._8_8_ = 0;
  local_200._0_8_ = *(undefined8 *)&(this->_interface)._position.field_0;
  local_200.field_0.z = (this->_interface)._position.field_0.field_0.z;
  glm::translate<float,(glm::precision)0>
            (&planeUpMatrix,(glm *)&methodName,
             (tmat4x4<float,_(glm::precision)0> *)&local_200.field_0,
             (tvec3<float,_(glm::precision)0> *)v);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x3f800000;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._12_8_ = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x3f800000;
  local_210._0_8_ = 0x3f800000;
  local_210.field_0.z = 0.0;
  glm::rotate<float,(glm::precision)0>
            (&local_1f0,(glm *)&data,(tmat4x4<float,_(glm::precision)0> *)&local_210.field_0,
             (this->_interface)._rotation.field_0.field_0.x * 0.017453292,
             (tvec3<float,_(glm::precision)0> *)v);
  glm::operator*((tmat4x4<float,_(glm::precision)0> *)local_5b0,&planeUpMatrix,&local_1f0);
  in_time_t._0_4_ = 0x3f800000;
  in_time_t._4_4_ = 0;
  uStack_168 = 0;
  uStack_164 = 0;
  local_15c = 0x3f800000;
  local_158 = 0;
  uStack_150 = 0;
  local_148 = 0x3f800000;
  local_144 = 0;
  uStack_13c = 0;
  local_134 = 0x3f800000;
  local_220._0_8_ = 0x3f80000000000000;
  local_220.field_0.z = 0.0;
  glm::rotate<float,(glm::precision)0>
            ((tmat4x4<float,_(glm::precision)0> *)&orig,(glm *)&in_time_t,
             (tmat4x4<float,_(glm::precision)0> *)&local_220.field_0,
             (this->_interface)._rotation.field_0.field_0.y * 0.017453292,
             (tvec3<float,_(glm::precision)0> *)v);
  glm::operator*((tmat4x4<float,_(glm::precision)0> *)&ss,
                 (tmat4x4<float,_(glm::precision)0> *)local_5b0,
                 (tmat4x4<float,_(glm::precision)0> *)&orig);
  local_b0 = 0x3f800000;
  local_ac = 0;
  uStack_a4 = 0;
  local_9c = 0x3f800000;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0x3f800000;
  local_84 = 0;
  uStack_7c = 0;
  local_74 = 0x3f800000;
  local_230._0_8_ = (this->_interface)._size.field_0;
  local_230.field_0.z = 1.0;
  glm::scale<float,(glm::precision)0>
            (&local_70,(glm *)&local_b0,(tmat4x4<float,_(glm::precision)0> *)&local_230.field_0,
             (tvec3<float,_(glm::precision)0> *)v);
  glm::operator*(&lightWorldMatrix,(tmat4x4<float,_(glm::precision)0> *)&ss,&local_70);
  _ss = 0x3f800000;
  auStack_3a8._0_4_ = 0;
  auStack_3a8._4_4_ = 0x3f800000;
  auStack_3a8._8_8_ = 0;
  auStack_3a8._16_4_ = 0.0;
  aStack_394.field_0.x = 0.0;
  aStack_394._4_2_ = 0;
  aStack_394._6_2_ = 0x3f80;
  aStack_394.field_0.z = 0.0;
  aStack_394.field_0.w = 0.0;
  aStack_384.field_0.x = 0.0;
  aStack_384.field_0.y = 0.0;
  aStack_384.field_0.z = 1.0;
  local_5b0._0_8_ = (element_type *)0x3f800000;
  local_5b0._8_4_ = 0.0;
  glm::rotate<float,(glm::precision)0>
            (&planeUpMatrix,(glm *)&ss,(tmat4x4<float,_(glm::precision)0> *)local_5b0,1.5707964,
             (tvec3<float,_(glm::precision)0> *)v);
  pDVar7 = (this->_deferredPipeline)._M_t.
           super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ._M_t.
           super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl;
  glm::operator*((tmat4x4<float,_(glm::precision)0> *)&local_f0[0].field_0,&lightWorldMatrix,
                 &planeUpMatrix);
  modelMatrix_00.value[0].field_0.field_0.z = (float)(int)local_f0[0]._8_8_;
  modelMatrix_00.value[0].field_0._0_8_ = local_f0[0]._0_8_;
  modelMatrix_00.value[0].field_0.field_0.w = (float)(int)((ulong)local_f0[0]._8_8_ >> 0x20);
  modelMatrix_00.value[1].field_0.field_0.x = (float)(int)local_f0[1]._0_8_;
  modelMatrix_00.value[1].field_0.field_0.y = (float)(int)((ulong)local_f0[1]._0_8_ >> 0x20);
  modelMatrix_00.value[1].field_0.field_0.z = (float)(int)local_f0[1]._8_8_;
  modelMatrix_00.value[1].field_0.field_0.w = (float)(int)((ulong)local_f0[1]._8_8_ >> 0x20);
  modelMatrix_00.value[2].field_0._0_8_ = local_d0;
  modelMatrix_00.value[2].field_0._8_8_ = uStack_c8;
  modelMatrix_00.value[3].field_0._0_8_ = local_c0;
  modelMatrix_00.value[3].field_0._8_8_ = uStack_b8;
  DeferredRenderingPipeline::setModelMatrix(pDVar7,modelMatrix_00);
  viewMatrix_01.value[0].field_0.field_0.z = (float)(int)viewMatrix.value[0].field_0._8_8_;
  viewMatrix_01.value[0].field_0._0_8_ = viewMatrix.value[0].field_0._0_8_;
  viewMatrix_01.value[0].field_0.field_0.w =
       (float)(int)((ulong)viewMatrix.value[0].field_0._8_8_ >> 0x20);
  viewMatrix_01.value[1].field_0.field_0.x = (float)(int)viewMatrix.value[1].field_0._0_8_;
  viewMatrix_01.value[1].field_0.field_0.y =
       (float)(int)((ulong)viewMatrix.value[1].field_0._0_8_ >> 0x20);
  viewMatrix_01.value[1].field_0.field_0.z = (float)(int)viewMatrix.value[1].field_0._8_8_;
  viewMatrix_01.value[1].field_0.field_0.w =
       (float)(int)((ulong)viewMatrix.value[1].field_0._8_8_ >> 0x20);
  viewMatrix_01.value[2].field_0._0_8_ = viewMatrix.value[2].field_0._0_8_;
  viewMatrix_01.value[2].field_0._8_8_ = viewMatrix.value[2].field_0._8_8_;
  viewMatrix_01.value[3].field_0._0_8_ = viewMatrix.value[3].field_0._0_8_;
  viewMatrix_01.value[3].field_0._8_8_ = viewMatrix.value[3].field_0._8_8_;
  DeferredRenderingPipeline::setViewMatrix
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,
             viewMatrix_01);
  projectionMatrix_00.value[0].field_0.field_0.z = (float)(int)projMatrix.value[0].field_0._8_8_;
  projectionMatrix_00.value[0].field_0._0_8_ = projMatrix.value[0].field_0._0_8_;
  projectionMatrix_00.value[0].field_0.field_0.w =
       (float)(int)((ulong)projMatrix.value[0].field_0._8_8_ >> 0x20);
  projectionMatrix_00.value[1].field_0.field_0.x = (float)(int)projMatrix.value[1].field_0._0_8_;
  projectionMatrix_00.value[1].field_0.field_0.y =
       (float)(int)((ulong)projMatrix.value[1].field_0._0_8_ >> 0x20);
  projectionMatrix_00.value[1].field_0.field_0.z = (float)(int)projMatrix.value[1].field_0._8_8_;
  projectionMatrix_00.value[1].field_0.field_0.w =
       (float)(int)((ulong)projMatrix.value[1].field_0._8_8_ >> 0x20);
  projectionMatrix_00.value[2].field_0._0_8_ = projMatrix.value[2].field_0._0_8_;
  projectionMatrix_00.value[2].field_0._8_8_ = projMatrix.value[2].field_0._8_8_;
  projectionMatrix_00.value[3].field_0._0_8_ = projMatrix.value[3].field_0._0_8_;
  projectionMatrix_00.value[3].field_0._8_8_ = projMatrix.value[3].field_0._8_8_;
  DeferredRenderingPipeline::setProjectionMatrix
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,
             projectionMatrix_00);
  DeferredRenderingPipeline::setMaterialID
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,0.3
            );
  (*(((this->_arealightMesh)._M_t.
      super___uniq_ptr_impl<fw::Mesh<fw::StandardVertex3D>,_std::default_delete<fw::Mesh<fw::StandardVertex3D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_fw::Mesh<fw::StandardVertex3D>_*,_std::default_delete<fw::Mesh<fw::StandardVertex3D>_>_>
      .super__Head_base<0UL,_fw::Mesh<fw::StandardVertex3D>_*,_false>._M_head_impl)->super_IMesh).
    _vptr_IMesh[3])();
  DeferredRenderingPipeline::endGeometryPass
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl);
  iVar8.field_0 =
       (anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2)
       *(anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2 *)
        &(((this->_deferredPipeline)._M_t.
           super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ._M_t.
           super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl)->
         _resolution).field_0.field_0;
  EVar3 = (this->_interface)._selectedArealightMethod;
  (*glad_glBindFramebuffer)(0x8d40,this->_intermediateFBO);
  GVar29 = iVar8.field_0._0_4_;
  GVar28 = iVar8.field_0._4_4_;
  (*glad_glViewport)(0,0,GVar29,GVar28);
  (*glad_glClearColor)(0.0,0.0,0.0,1.0);
  if (EVar3 == AREALIGHT_GROUNDTRUTH) {
    GVar21 = 0x100;
    if (this->_restartIncrementalRendering == true) {
      ((this->_groundTruth).super___shared_ptr<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_numRender = 0;
      _ss = 0x1ea4f0;
      auStack_3a8._0_4_ = 0x18d14b;
      auStack_3a8._4_4_ = 0;
      auStack_3a8._8_8_ = 0x197;
      auStack_3a8._16_4_ = 2.281966e-39;
      aStack_394.field_0.x = 0.0;
      aStack_394._4_2_ = 0;
      aStack_394.field_0.w = 0.0;
      aStack_384.field_0.x = 0.0;
      aStack_384.field_0.y = (float)((uint)aStack_384.field_0.y & 0xffffff00);
      aStack_384.field_0.w = 0.0;
      aStack_374.field_0.x = 0.0;
      aStack_374.field_0.y = 2.459289e-39;
      aStack_374.field_0.z = 0.0;
      aStack_374.field_0.w = 2.8026e-45;
      aStack_364.field_0.y = 0.0;
      aStack_364.field_0.z = 0.0;
      aStack_364.field_0.w = 0.0;
      uStack_354 = 0;
      local_350 = (pointer)0x0;
      pWVar16 = el::base::Writer::construct((Writer *)&ss,1,"framework");
      el::base::Writer::operator<<(pWVar16,(char (*) [33])"Restarting incremental rendering");
      el::base::Writer::~Writer((Writer *)&ss);
      if ((this->_restartIncrementalRendering & 1U) != 0) goto LAB_0010e7aa;
    }
  }
  else {
LAB_0010e7aa:
    this->_restartIncrementalRendering = false;
    GVar21 = 0x4100;
  }
  (*glad_glClear)(GVar21);
  pDVar7 = (this->_deferredPipeline)._M_t.
           super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ._M_t.
           super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl;
  GVar4 = pDVar7->_gPosition;
  GVar5 = pDVar7->_gNormal;
  GVar6 = pDVar7->_gColor;
  (*glad_glBindFramebuffer)(0x8ca8,pDVar7->_gBuffer);
  (*glad_glBindFramebuffer)(0x8ca9,this->_intermediateFBO);
  (*glad_glBlitFramebuffer)(0,0,GVar29,GVar28,0,0,GVar29,GVar28,0x100,0x2600);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,GVar6);
  (*glad_glActiveTexture)(0x84c1);
  (*glad_glBindTexture)(0xde1,GVar5);
  (*glad_glActiveTexture)(0x84c2);
  (*glad_glBindTexture)(0xde1,GVar4);
  if (EVar3 == AREALIGHT_LTC) {
    pLVar10 = (this->_ltc).
              super___shared_ptr<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pLVar10->_flux = (this->_interface)._flux;
    LinearlyTransformedCosines::setCamera(pLVar10,&viewMatrix);
    pLVar10 = (this->_ltc).
              super___shared_ptr<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    auStack_3a8._0_4_ = 0;
    auStack_3a8._4_4_ = 0;
    _ss = 0;
    auStack_3a8._8_8_ = 0x3f8000003f800000;
    auStack_3a8._16_4_ = 1.0;
    aStack_394.field_0.x = (float)lightWorldMatrix.value[0].field_0._0_8_;
    aStack_394._4_2_ = (undefined2)((ulong)lightWorldMatrix.value[0].field_0._0_8_ >> 0x20);
    aStack_394._6_2_ = (undefined2)((ulong)lightWorldMatrix.value[0].field_0._0_8_ >> 0x30);
    aStack_394.field_0.z = (float)lightWorldMatrix.value[0].field_0._8_8_;
    aStack_394.field_0.w = (float)((ulong)lightWorldMatrix.value[0].field_0._8_8_ >> 0x20);
    aStack_384.field_0.x = (float)lightWorldMatrix.value[1].field_0._0_8_;
    aStack_384.field_0.y = (float)((ulong)lightWorldMatrix.value[1].field_0._0_8_ >> 0x20);
    aStack_384.field_0.z = (float)lightWorldMatrix.value[1].field_0._8_8_;
    aStack_384.field_0.w = (float)((ulong)lightWorldMatrix.value[1].field_0._8_8_ >> 0x20);
    aStack_374.field_0.x = (float)lightWorldMatrix.value[2].field_0._0_8_;
    aStack_374.field_0.y = (float)((ulong)lightWorldMatrix.value[2].field_0._0_8_ >> 0x20);
    aStack_374.field_0.z = (float)lightWorldMatrix.value[2].field_0._8_8_;
    aStack_374.field_0.w = (float)((ulong)lightWorldMatrix.value[2].field_0._8_8_ >> 0x20);
    aStack_364.field_0.x = (float)lightWorldMatrix.value[3].field_0._0_8_;
    aStack_364.field_0.y = (float)((ulong)lightWorldMatrix.value[3].field_0._0_8_ >> 0x20);
    aStack_364.field_0.z = (float)lightWorldMatrix.value[3].field_0._8_8_;
    aStack_364.field_0.w = (float)((ulong)lightWorldMatrix.value[3].field_0._8_8_ >> 0x20);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&ss;
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::vector
              (&local_4d0,__l_00,(allocator_type *)local_5b0);
    LinearlyTransformedCosines::setLights(pLVar10,&local_4d0);
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::~vector
              (&local_4d0);
    std::
    _Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::~_Vector_base((_Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                     *)&ss);
    LinearlyTransformedCosines::render
              ((this->_ltc).
               super___shared_ptr<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  else if (EVar3 == AREALIGHT_CLUSTER) {
    peVar9 = (this->_pointLightCluster).
             super___shared_ptr<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar9->_lightFlux = (this->_interface)._flux;
    (peVar9->_clusterSize).field_0 = (this->_interface)._clusterSize.field_0;
    PointLightCluster::setCamera
              ((this->_pointLightCluster).
               super___shared_ptr<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &viewMatrix,&projMatrix);
    this_00 = (this->_pointLightCluster).
              super___shared_ptr<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auStack_3a8._0_4_ = 0;
    auStack_3a8._4_4_ = 0;
    _ss = 0;
    auStack_3a8._8_8_ = 0x3f8000003f800000;
    auStack_3a8._16_4_ = 1.0;
    aStack_394.field_0.x = (float)lightWorldMatrix.value[0].field_0._0_8_;
    aStack_394._4_2_ = (undefined2)((ulong)lightWorldMatrix.value[0].field_0._0_8_ >> 0x20);
    aStack_394._6_2_ = (undefined2)((ulong)lightWorldMatrix.value[0].field_0._0_8_ >> 0x30);
    aStack_394.field_0.z = (float)lightWorldMatrix.value[0].field_0._8_8_;
    aStack_394.field_0.w = (float)((ulong)lightWorldMatrix.value[0].field_0._8_8_ >> 0x20);
    aStack_384.field_0.x = (float)lightWorldMatrix.value[1].field_0._0_8_;
    aStack_384.field_0.y = (float)((ulong)lightWorldMatrix.value[1].field_0._0_8_ >> 0x20);
    aStack_384.field_0.z = (float)lightWorldMatrix.value[1].field_0._8_8_;
    aStack_384.field_0.w = (float)((ulong)lightWorldMatrix.value[1].field_0._8_8_ >> 0x20);
    aStack_374.field_0.x = (float)lightWorldMatrix.value[2].field_0._0_8_;
    aStack_374.field_0.y = (float)((ulong)lightWorldMatrix.value[2].field_0._0_8_ >> 0x20);
    aStack_374.field_0.z = (float)lightWorldMatrix.value[2].field_0._8_8_;
    aStack_374.field_0.w = (float)((ulong)lightWorldMatrix.value[2].field_0._8_8_ >> 0x20);
    aStack_364.field_0.x = (float)lightWorldMatrix.value[3].field_0._0_8_;
    aStack_364.field_0.y = (float)((ulong)lightWorldMatrix.value[3].field_0._0_8_ >> 0x20);
    aStack_364.field_0.z = (float)lightWorldMatrix.value[3].field_0._8_8_;
    aStack_364.field_0.w = (float)((ulong)lightWorldMatrix.value[3].field_0._8_8_ >> 0x20);
    __l._M_len = 1;
    __l._M_array = (iterator)&ss;
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::vector
              (&local_4e8,__l,(allocator_type *)local_5b0);
    PointLightCluster::setLights(this_00,&local_4e8);
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::~vector
              (&local_4e8);
    std::
    _Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::~_Vector_base((_Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                     *)&ss);
    PointLightCluster::render
              ((this->_pointLightCluster).
               super___shared_ptr<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  else if (EVar3 == AREALIGHT_DISABLED) {
    renderClusters(this);
  }
  else if (EVar3 == AREALIGHT_GROUNDTRUTH) {
    aVar1 = (this->_interface)._size.field_0.field_0;
    pGVar11 = (this->_groundTruth).
              super___shared_ptr<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pGVar11->_radiosity = (this->_interface)._flux / (aVar1.y * aVar1.x);
    GroundTruth::setCamera(pGVar11,&viewMatrix,&projMatrix);
    pGVar11 = (this->_groundTruth).
              super___shared_ptr<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auStack_3a8._0_4_ = 0;
    auStack_3a8._4_4_ = 0;
    _ss = 0;
    auStack_3a8._8_8_ = 0x3f8000003f800000;
    auStack_3a8._16_4_ = 1.0;
    aStack_394.field_0.x = (float)lightWorldMatrix.value[0].field_0._0_8_;
    aStack_394._4_2_ = (undefined2)((ulong)lightWorldMatrix.value[0].field_0._0_8_ >> 0x20);
    aStack_394._6_2_ = (undefined2)((ulong)lightWorldMatrix.value[0].field_0._0_8_ >> 0x30);
    aStack_394.field_0.z = (float)lightWorldMatrix.value[0].field_0._8_8_;
    aStack_394.field_0.w = (float)((ulong)lightWorldMatrix.value[0].field_0._8_8_ >> 0x20);
    aStack_384.field_0.x = (float)lightWorldMatrix.value[1].field_0._0_8_;
    aStack_384.field_0.y = (float)((ulong)lightWorldMatrix.value[1].field_0._0_8_ >> 0x20);
    aStack_384.field_0.z = (float)lightWorldMatrix.value[1].field_0._8_8_;
    aStack_384.field_0.w = (float)((ulong)lightWorldMatrix.value[1].field_0._8_8_ >> 0x20);
    aStack_374.field_0.x = (float)lightWorldMatrix.value[2].field_0._0_8_;
    aStack_374.field_0.y = (float)((ulong)lightWorldMatrix.value[2].field_0._0_8_ >> 0x20);
    aStack_374.field_0.z = (float)lightWorldMatrix.value[2].field_0._8_8_;
    aStack_374.field_0.w = (float)((ulong)lightWorldMatrix.value[2].field_0._8_8_ >> 0x20);
    aStack_364.field_0.x = (float)lightWorldMatrix.value[3].field_0._0_8_;
    aStack_364.field_0.y = (float)((ulong)lightWorldMatrix.value[3].field_0._0_8_ >> 0x20);
    aStack_364.field_0.z = (float)lightWorldMatrix.value[3].field_0._8_8_;
    aStack_364.field_0.w = (float)((ulong)lightWorldMatrix.value[3].field_0._8_8_ >> 0x20);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&ss;
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::vector
              (&local_500,__l_01,(allocator_type *)local_5b0);
    GroundTruth::setLights(pGVar11,&local_500);
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::~vector
              (&local_500);
    std::
    _Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::~_Vector_base((_Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                     *)&ss);
    GroundTruth::render((this->_groundTruth).
                        super___shared_ptr<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  }
  (*glad_glBindFramebuffer)(0x8d40,0);
  x_00 = framebufferSize.field_0.field_0.x;
  y = framebufferSize.field_0.field_0.y;
  (*glad_glViewport)(0,0,framebufferSize.field_0.field_0.x,framebufferSize.field_0.field_0.y);
  (*glad_glClearColor)(0.007,0.11,0.15,1.0);
  (*glad_glClear)(0x4100);
  fw::ShaderProgram::use
            ((this->_blitSRGBProgram)._M_t.
             super___uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>._M_t.
             super__Tuple_impl<0UL,_fw::ShaderProgram_*,_std::default_delete<fw::ShaderProgram>_>.
             super__Head_base<0UL,_fw::ShaderProgram_*,_false>._M_head_impl);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,this->_intermediateFBOTexture);
  this_01 = (this->_blitSRGBProgram)._M_t.
            super___uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>._M_t.
            super__Tuple_impl<0UL,_fw::ShaderProgram_*,_std::default_delete<fw::ShaderProgram>_>.
            super__Head_base<0UL,_fw::ShaderProgram_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"TargetTexture",(allocator<char> *)local_5b0);
  fw::ShaderProgram::setUniform(this_01,(string *)&ss,0);
  std::__cxx11::string::~string((string *)&ss);
  RenderHelper::drawFullScreenQuad
            ((this->_renderHelper).
             super___shared_ptr<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  lVar17 = std::chrono::_V2::system_clock::now();
  fVar30 = ((float)(lVar17 - lVar15) / 1e+09) * 1000.0;
  this->_frameTimeMs = fVar30;
  if (this->_frame % 0x14 == 0) {
    (this->_interface)._renderTimeMs = fVar30;
  }
  if (this->_screenshotRequested != true) goto LAB_0010f0dc;
  lVar15 = std::chrono::_V2::system_clock::now();
  in_time_t = lVar15 / 1000000000;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&methodName,"",(allocator<char> *)&ss);
  switch((this->_interface)._selectedArealightMethod) {
  case AREALIGHT_DISABLED:
    break;
  case AREALIGHT_CLUSTER:
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    aVar12 = (((this->_pointLightCluster).
               super___shared_ptr<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_clusterSize).field_0.field_0;
    poVar18 = std::operator<<((ostream *)auStack_3a8,"point");
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,aVar12.x);
    poVar18 = std::operator<<(poVar18,"x");
    std::ostream::operator<<(poVar18,aVar12.y);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&methodName,(string *)local_5b0);
    std::__cxx11::string::~string((string *)local_5b0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    goto switchD_0010ecc7_default;
  case AREALIGHT_GROUNDTRUTH:
    break;
  case AREALIGHT_LTC:
    break;
  default:
    goto switchD_0010ecc7_default;
  }
  std::__cxx11::string::assign((char *)&methodName);
switchD_0010ecc7_default:
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator<<((ostream *)auStack_3a8,(string *)&methodName);
  poVar18 = std::operator<<((ostream *)auStack_3a8,"-flux-");
  std::ostream::operator<<(poVar18,(this->_interface)._flux);
  poVar18 = std::operator<<((ostream *)auStack_3a8,"-roughness-");
  std::ostream::operator<<(poVar18,(this->_interface)._roughness);
  ptVar19 = localtime(&in_time_t);
  __f._M_fmt = "-%Y-%m-%d-%H-%M-%S";
  __f._M_tmb = (tm *)ptVar19;
  std::operator<<((ostream *)auStack_3a8,__f);
  if ((this->_screenshotAnnotation)._M_string_length != 0) {
    poVar18 = std::operator<<((ostream *)auStack_3a8,"-");
    std::operator<<(poVar18,(string *)&this->_screenshotAnnotation);
  }
  std::operator<<((ostream *)auStack_3a8,".png");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,(long)(y * x_00 * 3),(allocator_type *)local_5b0);
  (*glad_glPixelStorei)(0xd05,1);
  (*glad_glReadPixels)
            (0,0,x_00,y,0x1907,0x1401,
             (void *)CONCAT44(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&orig,&data);
  iVar20 = (y + -1) * x_00 * 3;
  iVar23 = 0;
  for (iVar24 = 0; iVar24 < (int)y / 2; iVar24 = iVar24 + 1) {
    iVar26 = iVar23;
    iVar27 = iVar20;
    for (iVar25 = 0; iVar25 < (int)x_00; iVar25 = iVar25 + 1) {
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        lVar17 = (long)iVar26 +
                 CONCAT44(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                          data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start._0_4_);
        lVar22 = CONCAT44(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                          data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start._0_4_) + (long)iVar27;
        uVar2 = *(undefined1 *)(lVar15 + lVar17);
        *(undefined1 *)(lVar15 + lVar17) = *(undefined1 *)(lVar15 + lVar22);
        *(undefined1 *)(lVar15 + lVar22) = uVar2;
      }
      iVar27 = iVar27 + 3;
      iVar26 = iVar26 + 3;
    }
    iVar20 = iVar20 + x_00 * -3;
    iVar23 = iVar23 + x_00 * 3;
  }
  std::__cxx11::stringbuf::str();
  stbi_write_png((char *)local_5b0._0_8_,x_00,y,3,
                 (void *)CONCAT44(data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_),x_00 * 3);
  std::__cxx11::string::~string((string *)local_5b0);
  local_5b0._0_8_ = &PTR__Writer_001ea4f0;
  local_5b0._8_4_ = 1.79366e-43;
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/Application.cpp"
  ;
  local_598 = 0x220;
  local_590 = "virtual void arealights::Application::onRender()";
  local_588 = 0;
  local_580._0_8_ = 0;
  local_580.data.data[8] = '\0';
  local_570 = (Logger *)0x0;
  local_568 = "";
  local_560 = NormalLog;
  local_558 = (pointer)0x0;
  pbStack_550 = (pointer)0x0;
  local_548 = (pointer)0x0;
  pWVar16 = el::base::Writer::construct((Writer *)local_5b0,1,"framework");
  pWVar16 = el::base::Writer::operator<<(pWVar16,(char (*) [21])"Screenshot saved in ");
  std::__cxx11::stringbuf::str();
  pWVar16 = el::base::Writer::operator<<
                      (pWVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_1f0);
  pWVar16 = el::base::Writer::operator<<(pWVar16,(char (*) [2])0x1935e1);
  pWVar16 = el::base::Writer::operator<<(pWVar16,(int *)&framebufferSize);
  pWVar16 = el::base::Writer::operator<<(pWVar16,(char (*) [2])0x1b36d2);
  el::base::Writer::operator<<(pWVar16,&framebufferSize.field_0.field_0.y);
  std::__cxx11::string::~string((string *)&local_1f0);
  el::base::Writer::~Writer((Writer *)local_5b0);
  this->_screenshotRequested = false;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&orig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&methodName);
LAB_0010f0dc:
  fw::ImGuiApplication::onRender(&this->super_ImGuiApplication);
  fw::GenericKeyboardInput::nextFrame
            ((this->_keyboardInput).
             super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  fw::GenericMouseInput::nextFrame
            ((this->_mouseInput).
             super___shared_ptr<fw::GenericMouseInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

void Application::onRender()
{
    auto framebufferSize = getFramebufferSize();
    auto aspectRatio = static_cast<float>(framebufferSize.x) / framebufferSize.y;

    auto frameRenderingStart = std::chrono::high_resolution_clock::now();

    auto viewMatrix = _camera->getViewMatrix();
    auto projMatrix = glm::perspective(glm::radians(45.0f), aspectRatio, 0.1f, 100.0f);

    _deferredPipeline->startGeometryPass();

    glEnable(GL_DEPTH_TEST);

    _deferredPipeline->setModelMatrix({});
    _deferredPipeline->setViewMatrix(viewMatrix);
    _deferredPipeline->setProjectionMatrix(projMatrix);
    _deferredPipeline->setMaterialID(0.1f);

    _materialMap[_interface.getMaterialId()].second->bind();

    _deferredPipeline->getShader()->setUniform("SolidMode", _interface.getSceneId());
    _deferredPipeline->getShader()->setUniform("MetalnessConst", _interface.getMetalness());
    _deferredPipeline->getShader()->setUniform("RoughnessConst", _interface.getRoughness());

    _planeMesh->render();

    auto lightWorldMatrix = glm::translate({}, _interface.getPosition()) *
        glm::rotate(
            glm::mat4{},
            glm::radians(_interface.getRotation().x),
            glm::vec3{1.0f, 0.0f, 0.0f}
        ) *
        glm::rotate(
            glm::mat4{},
            glm::radians(_interface.getRotation().y),
            glm::vec3{0.0f, 1.0f, 0.0f}
        ) *
        glm::scale({}, glm::vec3{_interface.getSize(), 1.0f});

    auto planeUpMatrix = glm::rotate(glm::mat4{}, glm::radians(90.0f), glm::vec3{1.0f, 0.0f, 0.0f});
    _deferredPipeline->setModelMatrix(lightWorldMatrix * planeUpMatrix);
    _deferredPipeline->setViewMatrix(viewMatrix);
    _deferredPipeline->setProjectionMatrix(projMatrix);
    _deferredPipeline->setMaterialID(0.3f);
    _arealightMesh->render();

    _deferredPipeline->endGeometryPass();

    auto gbufferResolution = _deferredPipeline->getFramebufferSize();

    auto mode = _interface.getArealightMethod();

    glBindFramebuffer(GL_FRAMEBUFFER, _intermediateFBO);
    glViewport(0, 0, gbufferResolution.x, gbufferResolution.y);
    glClearColor(0.0f, 0.0f, 0.0f, 1.0f);

    GLbitfield clearMask = GL_DEPTH_BUFFER_BIT;

    const auto isIncremental = (mode == AREALIGHT_GROUNDTRUTH);

    if (mode == AREALIGHT_GROUNDTRUTH && _restartIncrementalRendering) {
        _groundTruth->restartIncrementalRendering();
        LOG(INFO) << "Restarting incremental rendering";
    }

    if (!isIncremental || _restartIncrementalRendering)
    {
        clearMask |= GL_COLOR_BUFFER_BIT;
        _restartIncrementalRendering = false;
    }

    glClear(clearMask);

    auto positionBuffer = _deferredPipeline->getPositionBuffer();
    auto normalBuffer = _deferredPipeline->getNormalBuffer();
    auto colorBuffer = _deferredPipeline->getColorBuffer();

    glBindFramebuffer(GL_READ_FRAMEBUFFER, _deferredPipeline->getFramebuffer());
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, _intermediateFBO);

    glBlitFramebuffer(
        0, 0, gbufferResolution.x, gbufferResolution.y,
        0, 0, gbufferResolution.x, gbufferResolution.y,
        GL_DEPTH_BUFFER_BIT,
        GL_NEAREST
    );

    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, colorBuffer);

    glActiveTexture(GL_TEXTURE1);
    glBindTexture(GL_TEXTURE_2D, normalBuffer);

    glActiveTexture(GL_TEXTURE2);
    glBindTexture(GL_TEXTURE_2D, positionBuffer);

    if (mode == AREALIGHT_DISABLED)
    {
        renderClusters();
    }
    else if (mode == AREALIGHT_LTC)
    {
        _ltc->setFlux(_interface.getFlux());
        _ltc->setCamera(viewMatrix);
        _ltc->setLights({{{1.0f, 1.0f, 1.0f}, lightWorldMatrix}});
        _ltc->render();
    }
    else if (mode == AREALIGHT_CLUSTER)
    {
        _pointLightCluster->setLightFlux(_interface.getFlux());
        _pointLightCluster->setClusterSize(_interface.getClusterSize());
        _pointLightCluster->setCamera(viewMatrix, projMatrix);
        _pointLightCluster->setLights({{{1.0f, 1.0f, 1.0f}, lightWorldMatrix}});
        _pointLightCluster->render();
    }
    else if (mode == AREALIGHT_GROUNDTRUTH)
    {
        auto lightSize = _interface.getSize();
        auto lightArea = lightSize.x * lightSize.y;
        _groundTruth->setRadiosity(_interface.getFlux() / lightArea);
        _groundTruth->setCamera(viewMatrix, projMatrix);
        _groundTruth->setLights({{{1.0f, 1.0f, 1.0f}, lightWorldMatrix}});
        _groundTruth->render();
    }

    glBindFramebuffer(GL_FRAMEBUFFER, 0);
    glViewport(0, 0, framebufferSize.x, framebufferSize.y);
    glClearColor(0.007f, 0.11f, 0.15f, 1.0f);
    glClear(GL_DEPTH_BUFFER_BIT | GL_COLOR_BUFFER_BIT);

    _blitSRGBProgram->use();

    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, _intermediateFBOTexture);
    _blitSRGBProgram->setUniform("TargetTexture", 0);

    _renderHelper->drawFullScreenQuad();

    auto frameRenderingEnd = std::chrono::high_resolution_clock::now();
    _frameTimeMs = std::chrono::duration<float>(frameRenderingEnd - frameRenderingStart).count() * 1000;

    if (_frame % 20 == 0) {
        _interface.setRenderTimeMs(_frameTimeMs);
    }

    if (_screenshotRequested) {
        auto now = std::chrono::system_clock::now();
        auto in_time_t = std::chrono::system_clock::to_time_t(now);

        std::string methodName = "";
        switch (_interface.getArealightMethod()) {
        case AREALIGHT_DISABLED:
            methodName = "disabled";
            break;
        case AREALIGHT_CLUSTER:
        {
            std::stringstream ss;
            auto clusterSize = _pointLightCluster->getClusterSize();
            ss << "point" << clusterSize.x << "x" << clusterSize.y;
            methodName = ss.str();
            break;
        }
        case AREALIGHT_GROUNDTRUTH:
            methodName = "gt";
            break;
        case AREALIGHT_LTC:
            methodName = "ltc";
            break;
        }

        std::stringstream ss;
        ss << methodName;
        ss << "-flux-" << _interface.getFlux();
        ss << "-roughness-" << _interface.getRoughness();
        ss << std::put_time(std::localtime(&in_time_t), "-%Y-%m-%d-%H-%M-%S");
        if (_screenshotAnnotation.length() > 0) {
            ss << "-" << _screenshotAnnotation;
        }
        ss << ".png";

        int stride = 3 * sizeof(unsigned char) * framebufferSize.x;
        std::vector<unsigned char> data(3 * framebufferSize.x * framebufferSize.y);
        glPixelStorei(GL_PACK_ALIGNMENT, 1);
        glReadPixels(0, 0, framebufferSize.x, framebufferSize.y, GL_RGB, GL_UNSIGNED_BYTE, data.data());
        std::vector<unsigned char> orig = data;

        // We have to flip image to save it correctly.
        for (int y = 0; y < framebufferSize.y/2; ++y) {
            for (int x = 0; x < framebufferSize.x; ++x) {
                auto sourceBase = 3 * (framebufferSize.x * y + x);
                auto targetBase = 3 * (framebufferSize.x * (framebufferSize.y - y - 1) + x);
                for (int i = 0; i < 3; ++i) {
                    std::swap(data[sourceBase + i], data[targetBase + i]);
                }
            }
        }

        stbi_write_png(ss.str().c_str(), framebufferSize.x, framebufferSize.y, 3, data.data(), stride);

        LOG(INFO) << "Screenshot saved in " << ss.str() << " " << framebufferSize.x << "x" << framebufferSize.y;

        _screenshotRequested = false;
    }

    ImGuiApplication::onRender();

    // buffers are swapped after onRender by default

    _keyboardInput->nextFrame();
    _mouseInput->nextFrame();
}